

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf-cursor.c
# Opt level: O1

int coda_cdf_cursor_goto_array_element_by_index(coda_cursor *cursor,long index)

{
  int iVar1;
  coda_type *pcVar2;
  long lVar3;
  coda_dynamic_type_struct *pcVar4;
  long in_FS_OFFSET;
  
  if (*(int *)(in_FS_OFFSET + -0x1208) != 0) {
    pcVar2 = (cursor->stack[(long)cursor->n + -1].type)->definition;
    lVar3._0_4_ = pcVar2[1].type_class;
    lVar3._4_4_ = pcVar2[1].read_type;
    if ((index < 0) || (lVar3 <= index)) {
      coda_set_error(-0x6b,"array index (%ld) exceeds array range [0:%ld)");
      return -1;
    }
  }
  iVar1 = cursor->n;
  pcVar4 = *(coda_dynamic_type_struct **)(cursor->stack[(long)iVar1 + -1].type + 2);
  cursor->n = iVar1 + 1;
  cursor->stack[iVar1].type = pcVar4;
  cursor->stack[iVar1].index = index;
  cursor->stack[iVar1].bit_offset = -1;
  return 0;
}

Assistant:

int coda_cdf_cursor_goto_array_element_by_index(coda_cursor *cursor, long index)
{
    coda_dynamic_type *base_type;

    /* check the range for index */
    if (coda_option_perform_boundary_checks)
    {
        long num_elements;

        num_elements = ((coda_type_array *)cursor->stack[cursor->n - 1].type->definition)->num_elements;
        if (index < 0 || index >= num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array index (%ld) exceeds array range [0:%ld)", index,
                           num_elements);
            return -1;
        }
    }

    base_type = (coda_dynamic_type *)((coda_cdf_variable *)cursor->stack[cursor->n - 1].type)->base_type;

    cursor->n++;
    cursor->stack[cursor->n - 1].type = base_type;
    cursor->stack[cursor->n - 1].index = index;
    cursor->stack[cursor->n - 1].bit_offset = -1;       /* not applicable for netCDF backend */

    return 0;
}